

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O0

void __thiscall NaControlLaw::Reset(NaControlLaw *this)

{
  uint uVar1;
  NaControlLaw *this_00;
  NaDataFile *pNVar2;
  long in_RDI;
  char *unaff_retaddr;
  NaException exCode;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  NaPrintLog("Control law (set point) init\n");
  this_00 = (NaControlLaw *)(ulong)*(uint *)(in_RDI + 0x48);
  switch(this_00) {
  case (NaControlLaw *)0x0:
    uVar1 = NaDynAr<NaControlLawItem>::count((NaDynAr<NaControlLawItem> *)(in_RDI + 0x50));
    TotalTimeLength(this_00);
    NaPrintLog("..description (%d items) with total duration %g s\n",(ulong)uVar1);
    break;
  case (NaControlLaw *)0x1:
    NaPrintLog("..from file \"%s\"\n",*(undefined8 *)(in_RDI + 0x70));
    pNVar2 = OpenInputDataFile(unaff_retaddr);
    *(NaDataFile **)(in_RDI + 0x78) = pNVar2;
    (**(code **)(**(long **)(in_RDI + 0x78) + 0x28))();
    *(undefined4 *)(in_RDI + 0x80) = 0;
    break;
  case (NaControlLaw *)0x2:
    NaPrintLog(*(char **)(in_RDI + 0x88),"..manual from value %g\n");
    *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RDI + 0x88);
    break;
  case (NaControlLaw *)0x3:
    NaLinearNoiseGen::Reset
              ((NaLinearNoiseGen *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void    NaControlLaw::Reset ()
{
    NaPrintLog("Control law (set point) init\n");

    switch(source){

    case clsRandom:
        lin_rand.Reset();
        break;

    case clsDescription:
        NaPrintLog("..description (%d items) with total duration %g s\n",
                   items.count(), TotalTimeLength());
        break;

    case clsManual:
        NaPrintLog("..manual from value %g\n", start_value);
        current_value = start_value;
        break;

    case clsFromFile:
        NaPrintLog("..from file \"%s\"\n", filepath);
        try{
            // Open the file
            dataio = OpenInputDataFile(filepath);
            dataio->GoStartRecord();
            prev_index = 0;
        }
        catch(NaException exCode){
            // Handle file exceptions
            dataio = NULL;
            NaPrintLog("..can't open file \"%s\": exception code %d\n",
                       filepath, -1);
        }
        break;
    }
}